

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QRegion __thiscall QListView::visualRegionForSelection(QListView *this,QItemSelection *selection)

{
  int iVar1;
  QListViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  char cVar4;
  int row;
  int row_00;
  undefined8 uVar5;
  long in_RDX;
  undefined8 extraout_RDX;
  QItemSelectionRange *this_01;
  int r;
  QItemSelectionRange *pQVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  QModelIndex local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QListViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
  iVar1 = this_00->column;
  *(undefined1 **)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  local_48 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                           super_QAbstractScrollAreaPrivate.viewport);
  QVar7.x2.m_i = local_a8._8_4_;
  QVar7.y2.m_i = local_a8._12_4_;
  QVar7.x1.m_i = local_a8._0_4_;
  QVar7.y1.m_i = local_a8._4_4_;
  this_01 = *(QItemSelectionRange **)(in_RDX + 8);
  pQVar6 = this_01 + *(long *)(in_RDX + 0x10);
LAB_005151b8:
  local_a8 = (undefined1  [16])QVar7;
  if (this_01 == pQVar6) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return (QRegion)(QRegionData *)this;
  }
  bVar3 = QItemSelectionRange::isValid(this_01);
  QVar7 = (QRect)local_a8;
  if (bVar3) {
    local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::parent();
    bVar3 = ::operator!=(&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
    QVar7 = (QRect)local_a8;
    if (!bVar3) {
      row = QPersistentModelIndex::row();
      row_00 = QPersistentModelIndex::row();
      if ((this_00->viewMode != IconMode) && (this_00->wrap == false)) {
        for (; row <= row_00; row = row + 1) {
          bVar3 = QListViewPrivate::isHidden(this_00,row);
          if (!bVar3) break;
        }
        do {
          if (row_00 < row) goto LAB_005152f0;
          bVar3 = QListViewPrivate::isHidden(this_00,row_00);
          if (!bVar3) goto LAB_005152f0;
          row_00 = row_00 + -1;
        } while( true );
      }
      for (; QVar7 = (QRect)local_a8, row <= row_00; row = row + 1) {
        pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_88,pQVar2,row,iVar1,&local_68);
        QVar7 = (QRect)(**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].
                                    super_QArrayData)(selection,&local_88);
        local_a8 = (undefined1  [16])QVar7;
        cVar4 = QRect::intersects(&local_48);
        if (cVar4 != '\0') {
          QRegion::operator+=((QRegion *)this,(QRect *)local_a8);
        }
      }
    }
  }
  goto LAB_005152d2;
LAB_005152f0:
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
  (**(code **)(*(long *)pQVar2 + 0x60))(&local_88,pQVar2,row,iVar1,&local_68);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
  (**(code **)(*(long *)pQVar2 + 0x60))(local_a8,pQVar2,row_00,iVar1,&local_68);
  local_b8.x1.m_i = -0x55555556;
  local_b8.y1.m_i = -0x55555556;
  local_b8.x2.m_i = -0x55555556;
  local_b8.y2.m_i = -0x55555556;
  uVar5 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                    (selection,&local_88);
  (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
            (selection,local_a8);
  local_b8.x1.m_i = (int)uVar5;
  local_b8.y1.m_i = (int)((ulong)uVar5 >> 0x20);
  local_b8.x2.m_i = (int)extraout_RDX;
  local_b8.y2.m_i = (int)((ulong)extraout_RDX >> 0x20);
  cVar4 = QRect::intersects(&local_48);
  QVar7.x2.m_i = local_a8._8_4_;
  QVar7.y2.m_i = local_a8._12_4_;
  QVar7.x1.m_i = local_a8._0_4_;
  QVar7.y1.m_i = local_a8._4_4_;
  if (cVar4 != '\0') {
    QRegion::operator+=((QRegion *)this,&local_b8);
    QVar7.x2.m_i = local_a8._8_4_;
    QVar7.y2.m_i = local_a8._12_4_;
    QVar7.x1.m_i = local_a8._0_4_;
    QVar7.y1.m_i = local_a8._4_4_;
  }
LAB_005152d2:
  this_01 = this_01 + 1;
  goto LAB_005151b8;
}

Assistant:

QRegion QListView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QListView);
    // ### NOTE: this is a potential bottleneck in non-static mode
    int c = d->column;
    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &elem : selection) {
        if (!elem.isValid())
            continue;
        QModelIndex parent = elem.topLeft().parent();
        //we only display the children of the root in a listview
        //we're not interested in the other model indexes
        if (parent != d->root)
            continue;
        int t = elem.topLeft().row();
        int b = elem.bottomRight().row();
        if (d->viewMode == IconMode || d->isWrapping()) { // in non-static mode, we have to go through all selected items
            for (int r = t; r <= b; ++r) {
                const QRect &rect = visualRect(d->model->index(r, c, parent));
                if (viewportRect.intersects(rect))
                    selectionRegion += rect;
            }
        } else { // in static mode, we can optimize a bit
            while (t <= b && d->isHidden(t)) ++t;
            while (b >= t && d->isHidden(b)) --b;
            const QModelIndex top = d->model->index(t, c, parent);
            const QModelIndex bottom = d->model->index(b, c, parent);
            QRect rect(visualRect(top).topLeft(),
                       visualRect(bottom).bottomRight());
            if (viewportRect.intersects(rect))
                selectionRegion += rect;
        }
    }

    return selectionRegion;
}